

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition_XYZfunctions.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionPosition_XYZfunctions::ArchiveIN
          (ChFunctionPosition_XYZfunctions *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_60;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_48;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChFunctionPosition_XYZfunctions>(marchive);
  ChFunctionPosition::ArchiveIN(&this->super_ChFunctionPosition,marchive);
  local_30._value = &this->px;
  local_30._name = "px";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->py;
  local_48._name = "py";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->pz;
  local_60._name = "pz";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  return;
}

Assistant:

void ChFunctionPosition_XYZfunctions::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunctionPosition_XYZfunctions>();
	// deserialize parent class
    ChFunctionPosition::ArchiveIN(marchive);
    // deserialize all member data:
    marchive >> CHNVP(px);
	marchive >> CHNVP(py);
	marchive >> CHNVP(pz);
}